

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgtypes.c
# Opt level: O0

char * convertToNativePathSeparators(char *path)

{
  char *pcVar1;
  char *itr;
  char *path_local;
  
  while( true ) {
    pcVar1 = strchr(path,0x2f);
    if (pcVar1 == (char *)0x0) break;
    *pcVar1 = '/';
  }
  return path;
}

Assistant:

char * convertToNativePathSeparators(char *path) {
#if defined(U_MAKE_IS_NMAKE)
    char *itr;
    while ((itr = uprv_strchr(path, U_FILE_ALT_SEP_CHAR))) {
        *itr = U_FILE_SEP_CHAR;
    }
#endif
    return path;
}